

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

EmptyMemberSymbol *
slang::ast::EmptyMemberSymbol::fromSyntax
          (Compilation *compilation,Scope *scope,EmptyMemberSyntax *syntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  iterator this;
  reference pTVar2;
  long in_RDX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDI;
  Trivia trivia;
  iterator __end3;
  iterator __begin3;
  Scope *in_stack_00000078;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *__range3;
  bool anySkipped;
  DiagCode in_stack_00000094;
  EmptyMemberSymbol *result;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *in_stack_ffffffffffffff38;
  __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff40;
  BumpAllocator *in_stack_ffffffffffffff50;
  Token *this_00;
  undefined1 in_stack_ffffffffffffff60 [16];
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined2 in_stack_ffffffffffffff86;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_58;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *local_48;
  byte local_39;
  SourceLocation local_28;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *local_20;
  long local_18;
  
  local_18 = in_RDX;
  local_28 = parsing::Token::location((Token *)(in_RDX + 0x88));
  local_20 = (span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             BumpAllocator::emplace<slang::ast::EmptyMemberSymbol,slang::SourceLocation>
                       (in_stack_ffffffffffffff50,(SourceLocation *)in_RDI);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>(local_20,in_RDI);
  this_00 = in_stack_ffffffffffffff60._0_8_;
  syntax_00._M_extent._M_extent_value._0_5_ = in_stack_ffffffffffffff80;
  syntax_00._M_ptr = (pointer)in_stack_ffffffffffffff78;
  syntax_00._M_extent._M_extent_value._5_1_ = in_stack_ffffffffffffff85;
  syntax_00._M_extent._M_extent_value._6_2_ = in_stack_ffffffffffffff86;
  Symbol::setAttributes
            ((Symbol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff60._8_8_,syntax_00);
  bVar1 = std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::empty
                    ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                     0xff6139);
  if ((bVar1) && (bVar1 = parsing::Token::isMissing((Token *)(local_18 + 0x88)), !bVar1)) {
    local_39 = 0;
    slang::syntax::SyntaxNode::getFirstToken
              ((SyntaxNode *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_58 = parsing::Token::trivia(this_00);
    local_48 = &local_58;
    this = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::begin
                     (in_stack_ffffffffffffff38);
    std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::end
              ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)in_RDI);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                             (in_stack_ffffffffffffff40,
                              (__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff38), ((bVar1 ^ 0xffU) & 1) != 0) {
      pTVar2 = __gnu_cxx::
               __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
               ::operator*((__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                            *)&stack0xffffffffffffff90);
      if ((char)((ulong)*(undefined8 *)((long)&pTVar2->field_0 + 8) >> 0x28) == '\x06') {
        local_39 = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffff90);
    }
    if ((local_39 & 1) == 0) {
      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this._M_current);
      Scope::addDiag(in_stack_00000078,in_stack_00000094,(SourceRange)___range3);
    }
  }
  return (EmptyMemberSymbol *)local_20;
}

Assistant:

EmptyMemberSymbol& EmptyMemberSymbol::fromSyntax(Compilation& compilation, const Scope& scope,
                                                 const EmptyMemberSyntax& syntax) {
    auto result = compilation.emplace<EmptyMemberSymbol>(syntax.semi.location());
    result->setAttributes(scope, syntax.attributes);

    // Report a warning if this is just an empty semicolon hanging out for no reason,
    // but don't report if this was inserted due to an error elsewhere.
    if (syntax.attributes.empty() && !syntax.semi.isMissing()) {
        // If there are skipped nodes behind this semicolon don't report the warning,
        // as it's likely it's due to the error itself.
        bool anySkipped = false;
        for (auto trivia : syntax.getFirstToken().trivia()) {
            if (trivia.kind == TriviaKind::SkippedTokens) {
                anySkipped = true;
                break;
            }
        }

        if (!anySkipped)
            scope.addDiag(diag::EmptyMember, syntax.sourceRange());
    }

    return *result;
}